

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O2

int If_ManSatCheckXY(void *pSat,int nLutSize,word *pTruth,int nVars,uint uSet,word *pTBound,
                    word *pTFree,Vec_Int_t *vLits)

{
  byte bVar1;
  word *pTruth_00;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  word wVar8;
  ulong uVar9;
  uint i;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int nSSet;
  int nFSet;
  int nBSet;
  uint local_134;
  word *local_130;
  sat_solver *local_128;
  uint local_11c;
  word *local_118;
  ulong local_110;
  ulong local_108;
  word Res;
  int pFSet [15];
  int pSSet [15];
  int pBSet [15];
  
  nBSet = 0;
  nSSet = 0;
  nFSet = 0;
  uVar7 = (ulong)(uint)nLutSize;
  local_108 = (ulong)(uint)(1 << ((byte)nLutSize & 0x1f));
  bVar2 = (char)(nLutSize * 2) - 1U & 0x1f;
  uVar13 = 1 << bVar2;
  local_130 = pTBound;
  local_128 = (sat_solver *)pSat;
  local_118 = pTruth;
  Dau_DecSortSet(uSet,nVars,&nBSet,&nSSet,&nFSet);
  local_134 = nVars;
  if (nBSet + nSSet + nFSet != nVars) {
    __assert_fail("nBSet + nSSet + nFSet == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                  ,0xa3,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  if (nLutSize < nBSet + nSSet) {
    __assert_fail("nSSet + nBSet <= nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                  ,0xa5,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  local_110 = uVar7;
  if (nLutSize * 2 <= nSSet + nLutSize + nFSet) {
    __assert_fail("nLutSize + nSSet + nFSet <= 2*nLutSize - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                  ,0xa6,
                  "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                 );
  }
  if (vLits->nCap < (int)uVar13) {
    if (vLits->pArray == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar13 << 2);
    }
    else {
      piVar6 = (int *)realloc(vLits->pArray,(long)(int)uVar13 << 2);
    }
    vLits->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vLits->nCap = uVar13;
  }
  uVar7 = 0;
  uVar9 = 0;
  if (0 < 1 << bVar2) {
    uVar9 = (ulong)uVar13;
  }
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    vLits->pArray[uVar7] = -1;
  }
  vLits->nSize = uVar13;
  bVar1 = (byte)local_134 & 0x1f;
  uVar14 = 0 << bVar2;
  uVar13 = 0;
  if (0 < (int)local_134) {
    uVar13 = local_134;
  }
  local_11c = 1 << bVar1;
  if (1 << bVar1 < 1) {
    local_11c = uVar14;
  }
  while( true ) {
    if (uVar14 == local_11c) break;
    bVar2 = 0;
    iVar3 = 0;
    uVar11 = 0;
    iVar5 = 0;
    i = 0;
    for (uVar12 = 0; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      switch(uSet >> (bVar2 & 0x1f) & 3) {
      case 0:
        if ((uVar14 >> (uVar12 & 0x1f) & 1) != 0) {
          i = i | 1 << (iVar3 + (int)local_110 + nSSet & 0x1fU);
          pFSet[iVar3] = uVar12;
        }
        iVar3 = iVar3 + 1;
        break;
      case 1:
        if ((uVar14 >> (uVar12 & 0x1f) & 1) != 0) {
          i = i | 1 << (nSSet + iVar5 & 0x1fU);
          pBSet[iVar5] = uVar12;
        }
        iVar5 = iVar5 + 1;
        break;
      case 2:
        __assert_fail("Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                      ,0xc6,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      case 3:
        if ((uVar14 >> (uVar12 & 0x1f) & 1) != 0) {
          i = i | 1 << ((char)uVar11 + (byte)local_110 & 0x1f) | 1 << (uVar11 & 0x1f);
          pSSet[(int)uVar11] = uVar12;
        }
        uVar11 = uVar11 + 1;
      }
      bVar2 = bVar2 + 2;
    }
    if ((iVar5 != nBSet) || (iVar3 != nFSet)) {
      __assert_fail("iBSet == nBSet && iFSet == nFSet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                    ,200,
                    "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                   );
    }
    iVar3 = Vec_IntEntry(vLits,i);
    if (iVar3 != -1) {
      __assert_fail("Vec_IntEntry(vLits, mNew) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                    ,0xc9,
                    "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                   );
    }
    Vec_IntWriteEntry(vLits,i,(uint)((local_118[uVar14 >> 6] >> ((ulong)uVar14 & 0x3f) & 1) != 0));
    uVar14 = uVar14 + 1;
  }
  iVar15 = 2 << ((byte)local_110 & 0x1f);
  iVar3 = iVar15 * 2;
  iVar5 = 0;
  uVar7 = local_110;
  for (iVar10 = 0; iVar10 < vLits->nSize; iVar10 = iVar10 + 1) {
    iVar4 = Vec_IntEntry(vLits,iVar10);
    if (-1 < iVar4) {
      if (iVar15 + iVar10 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntWriteEntry(vLits,iVar5,iVar3 + (uint)(iVar4 == 0));
      uVar7 = local_110;
      iVar5 = iVar5 + 1;
    }
    iVar3 = iVar3 + 2;
  }
  if (iVar5 <= vLits->nSize) {
    vLits->nSize = iVar5;
    iVar10 = 0;
    iVar3 = sat_solver_solve(local_128,vLits->pArray,vLits->pArray + iVar5,0,0,0,0);
    if ((iVar3 == 1) && (iVar10 = 1, pTFree != (word *)0x0 && local_130 != (word *)0x0)) {
      iVar3 = (int)uVar7;
      if (iVar3 < nBSet + nSSet) {
        __assert_fail("nSSet + nBSet <= nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                      ,0xdd,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      }
      *local_130 = 0;
      iVar10 = 1;
      bVar2 = (byte)(nBSet + nSSet) & 0x1f;
      uVar14 = 0;
      uVar13 = 1 << bVar2;
      if (1 << bVar2 < 1) {
        uVar13 = uVar14;
      }
      for (; pTruth_00 = local_130, uVar13 != uVar14; uVar14 = uVar14 + 1) {
        iVar5 = sat_solver_var_value(local_128,uVar14);
        if (iVar5 != 0) {
          local_130[uVar14 >> 6] = local_130[uVar14 >> 6] | 1L << ((byte)uVar14 & 0x3f);
        }
      }
      wVar8 = Abc_Tt6Stretch(*local_130,nBSet + nSSet);
      *pTruth_00 = wVar8;
      if (iVar3 <= nFSet + nSSet) {
        __assert_fail("nSSet + nFSet + 1 <= nLutSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                      ,0xe5,
                      "int If_ManSatCheckXY(void *, int, word *, int, unsigned int, word *, word *, Vec_Int_t *)"
                     );
      }
      *pTFree = 0;
      bVar2 = (char)(nFSet + nSSet) + 1U & 0x1f;
      uVar9 = 0;
      uVar7 = (ulong)(uint)(1 << bVar2);
      if (1 << bVar2 < 1) {
        uVar7 = uVar9;
      }
      while (iVar5 = (int)uVar9, (int)uVar7 != iVar5) {
        iVar15 = sat_solver_var_value(local_128,(int)local_108 + iVar5);
        if (iVar15 != 0) {
          pTFree[uVar9 >> 6] = pTFree[uVar9 >> 6] | 1L << ((byte)uVar9 & 0x3f);
        }
        uVar9 = (ulong)(iVar5 + 1);
      }
      wVar8 = Abc_Tt6Stretch(*pTFree,nSSet + nFSet + 1);
      *pTFree = wVar8;
      if ((iVar3 == 4 && local_134 == 6) &&
         (Res = If_ManSat6Truth(*pTruth_00,wVar8,pBSet,nBSet,pSSet,nSSet,pFSet,nFSet),
         *local_118 != Res)) {
        Dau_DsdPrintFromTruth(local_118,6);
        Dau_DsdPrintFromTruth(&Res,6);
        Dau_DsdPrintFromTruth(pTruth_00,nBSet + nSSet);
        Dau_DsdPrintFromTruth(pTFree,nSSet + nFSet + 1);
        puts("Verification failed!");
      }
    }
    return iVar10;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int If_ManSatCheckXY( void * pSat, int nLutSize, word * pTruth, int nVars, unsigned uSet, word * pTBound, word * pTFree, Vec_Int_t * vLits )
{
    sat_solver * p = (sat_solver *)pSat;
    int iBSet, nBSet = 0, pBSet[IF_MAX_FUNC_LUTSIZE];
    int iSSet, nSSet = 0, pSSet[IF_MAX_FUNC_LUTSIZE];
    int iFSet, nFSet = 0, pFSet[IF_MAX_FUNC_LUTSIZE];
    int nMintsL = (1 << nLutSize);
    int nMintsF = (1 << (2 * nLutSize - 1));
    int v, Value, m, mNew, nMintsFNew, nMintsLNew;
    word Res;
    // collect variable sets
    Dau_DecSortSet( uSet, nVars, &nBSet, &nSSet, &nFSet );
    assert( nBSet + nSSet + nFSet == nVars );
    // check variable bounds
    assert( nSSet + nBSet <= nLutSize );
    assert( nLutSize + nSSet + nFSet <= 2*nLutSize - 1 );
    nMintsFNew = (1 << (nLutSize + nSSet + nFSet));
    // remap minterms
    Vec_IntFill( vLits, nMintsF, -1 );
    for ( m = 0; m < (1 << nVars); m++ )
    {
        mNew = iBSet = iSSet = iFSet = 0;
        for ( v = 0; v < nVars; v++ )
        {
            Value = ((uSet >> (v << 1)) & 3);
            if ( Value == 0 ) // FS
            {
                if ( ((m >> v) & 1) )
                    mNew |= 1 << (nLutSize + nSSet + iFSet), pFSet[iFSet] = v;
                iFSet++;
            }
            else if ( Value == 1 ) // BS
            {
                if ( ((m >> v) & 1) )
                    mNew |= 1 << (nSSet + iBSet), pBSet[iBSet] = v;
                iBSet++;
            }
            else if ( Value == 3 ) // SS
            {
                if ( ((m >> v) & 1) )
                {
                    mNew |= 1 << iSSet;
                    mNew |= 1 << (nLutSize + iSSet);
                    pSSet[iSSet] = v;
                }
                iSSet++;
            }
            else assert( Value == 0 );
        }
        assert( iBSet == nBSet && iFSet == nFSet );
        assert( Vec_IntEntry(vLits, mNew) == -1 );
        Vec_IntWriteEntry( vLits, mNew, Abc_TtGetBit(pTruth, m) );
    }
    // find assumptions
    v = 0;
    Vec_IntForEachEntry( vLits, Value, m )
    {
//        printf( "%d", (Value >= 0) ? Value : 2 );
        if ( Value >= 0 )
            Vec_IntWriteEntry( vLits, v++, Abc_Var2Lit(2 * nMintsL + m, !Value) );
    }
    Vec_IntShrink( vLits, v );
//    printf( " %d\n", Vec_IntSize(vLits) );
    // run SAT solver
    Value = sat_solver_solve( p, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
    if ( Value != l_True )
        return 0;
    if ( pTBound && pTFree )
    {
        // collect config
        assert( nSSet + nBSet <= nLutSize );
        *pTBound = 0;
        nMintsLNew = (1 << (nSSet + nBSet));
        for ( m = 0; m < nMintsLNew; m++ )
            if ( sat_solver_var_value(p, m) )
                Abc_TtSetBit( pTBound, m );
        *pTBound = Abc_Tt6Stretch( *pTBound, nSSet + nBSet );
        // collect configs
        assert( nSSet + nFSet + 1 <= nLutSize );
        *pTFree = 0;
        nMintsLNew = (1 << (1 + nSSet + nFSet));
        for ( m = 0; m < nMintsLNew; m++ )
            if ( sat_solver_var_value(p, nMintsL+m) )
                Abc_TtSetBit( pTFree, m );
        *pTFree = Abc_Tt6Stretch( *pTFree, 1 + nSSet + nFSet );
        if ( nVars != 6 || nLutSize != 4 )
            return 1;
        // verify the result
        Res = If_ManSat6Truth( *pTBound, *pTFree, pBSet, nBSet, pSSet, nSSet, pFSet, nFSet );
        if ( pTruth[0] != Res )
        {
            Dau_DsdPrintFromTruth( pTruth,  nVars );
            Dau_DsdPrintFromTruth( &Res,    nVars );
            Dau_DsdPrintFromTruth( pTBound, nSSet+nBSet );
            Dau_DsdPrintFromTruth( pTFree,  nSSet+nFSet+1 );
            printf( "Verification failed!\n" );
        }
    }
    return 1;
}